

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred.c
# Opt level: O1

void ihevc_weighted_pred_chroma_bi
               (WORD16 *pi2_src1,WORD16 *pi2_src2,UWORD8 *pu1_dst,WORD32 src_strd1,WORD32 src_strd2,
               WORD32 dst_strd,WORD32 wgt0_cb,WORD32 wgt0_cr,WORD32 off0_cb,WORD32 off0_cr,
               WORD32 wgt1_cb,WORD32 wgt1_cr,WORD32 off1_cb,WORD32 off1_cr,WORD32 shift,
               WORD32 lvl_shift1,WORD32 lvl_shift2,WORD32 ht,WORD32 wd)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  if (0 < ht) {
    bVar1 = (byte)shift;
    iVar2 = 0;
    do {
      if (0 < wd) {
        lVar3 = 0;
        do {
          iVar4 = (pi2_src2[lVar3] + lvl_shift2) * wgt1_cb +
                  (pi2_src1[lVar3] + lvl_shift1) * wgt0_cb +
                  (off0_cb + off1_cb + 1 << (bVar1 - 1 & 0x1f));
          if (iVar4 >> (bVar1 & 0x1f) < 1) {
            iVar4 = 0;
          }
          iVar4 = iVar4 >> (bVar1 & 0x1f);
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          pu1_dst[lVar3] = (UWORD8)iVar4;
          iVar4 = (pi2_src2[lVar3 + 1] + lvl_shift2) * wgt1_cr +
                  (pi2_src1[lVar3 + 1] + lvl_shift1) * wgt0_cr +
                  (off1_cr + off0_cr + 1 << (bVar1 - 1 & 0x1f));
          if (iVar4 >> (bVar1 & 0x1f) < 1) {
            iVar4 = 0;
          }
          iVar4 = iVar4 >> (bVar1 & 0x1f);
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          pu1_dst[lVar3 + 1] = (UWORD8)iVar4;
          lVar3 = lVar3 + 2;
        } while (lVar3 < wd * 2);
      }
      pu1_dst = pu1_dst + dst_strd;
      iVar2 = iVar2 + 1;
      pi2_src2 = pi2_src2 + src_strd2;
      pi2_src1 = pi2_src1 + src_strd1;
    } while (iVar2 != ht);
  }
  return;
}

Assistant:

void ihevc_weighted_pred_chroma_bi(WORD16 *pi2_src1,
                                   WORD16 *pi2_src2,
                                   UWORD8 *pu1_dst,
                                   WORD32 src_strd1,
                                   WORD32 src_strd2,
                                   WORD32 dst_strd,
                                   WORD32 wgt0_cb,
                                   WORD32 wgt0_cr,
                                   WORD32 off0_cb,
                                   WORD32 off0_cr,
                                   WORD32 wgt1_cb,
                                   WORD32 wgt1_cr,
                                   WORD32 off1_cb,
                                   WORD32 off1_cr,
                                   WORD32 shift,
                                   WORD32 lvl_shift1,
                                   WORD32 lvl_shift2,
                                   WORD32 ht,
                                   WORD32 wd)
{
    WORD32 row, col;
    WORD32 i4_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col += 2)
        {
            i4_tmp = (pi2_src1[col] + lvl_shift1) * wgt0_cb;
            i4_tmp += (pi2_src2[col] + lvl_shift2) * wgt1_cb;
            i4_tmp += (off0_cb + off1_cb + 1) << (shift - 1);

            pu1_dst[col] = CLIP_U8(i4_tmp >> shift);

            i4_tmp = (pi2_src1[col + 1] + lvl_shift1) * wgt0_cr;
            i4_tmp += (pi2_src2[col + 1] + lvl_shift2) * wgt1_cr;
            i4_tmp += (off0_cr + off1_cr + 1) << (shift - 1);

            pu1_dst[col + 1] = CLIP_U8(i4_tmp >> shift);
        }

        pi2_src1 += src_strd1;
        pi2_src2 += src_strd2;
        pu1_dst += dst_strd;
    }
}